

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satClause.h
# Opt level: O1

int Sat_MemAppend(Sat_Mem_t *p,int *pArray,int nSize,int lrn,int fPlus1)

{
  uint *puVar1;
  int **ppiVar2;
  int *piVar3;
  int iVar4;
  size_t __size;
  uint uVar5;
  
  uVar5 = ((nSize + lrn) - (nSize + lrn + 2 >> 0x1f)) + 2U & 0xfffffffe;
  iVar4 = 1 << ((byte)p->nPageSize & 0x1f);
  if ((int)(uVar5 + 3) < iVar4) {
    ppiVar2 = p->pPages;
    piVar3 = ppiVar2[p->iPage[(uint)lrn]];
    if (iVar4 <= (int)(*piVar3 + uVar5 + 2)) {
      iVar4 = p->iPage[(uint)lrn] + 2;
      p->iPage[(uint)lrn] = iVar4;
      if (p->nPagesAlloc <= iVar4) {
        __size = (long)p->nPagesAlloc << 4;
        if (ppiVar2 == (int **)0x0) {
          ppiVar2 = (int **)malloc(__size);
        }
        else {
          ppiVar2 = (int **)realloc(ppiVar2,__size);
        }
        p->pPages = ppiVar2;
        iVar4 = p->nPagesAlloc;
        memset(ppiVar2 + iVar4,0,(long)iVar4 << 3);
        p->nPagesAlloc = iVar4 * 2;
      }
      ppiVar2 = p->pPages;
      iVar4 = p->iPage[(uint)lrn];
      if (ppiVar2[iVar4] == (int *)0x0) {
        piVar3 = (int *)malloc((0x100000000 << ((byte)p->nPageSize & 0x3f)) >> 0x1e);
        ppiVar2[iVar4] = piVar3;
      }
      piVar3 = p->pPages[iVar4];
      *piVar3 = 2;
    }
    piVar3[*piVar3] = 0;
    puVar1 = (uint *)(piVar3 + *piVar3);
    *puVar1 = lrn & 1U | *puVar1 & 0x7fe | nSize << 0xb;
    if (pArray != (int *)0x0) {
      memcpy(puVar1 + 1,pArray,(long)nSize << 2);
    }
    if (lrn != 0) {
      puVar1[(ulong)(*puVar1 >> 0xb) + 1] = p->nEntries[(uint)lrn];
    }
    p->nEntries[(uint)lrn] = p->nEntries[(uint)lrn] + 1;
    *piVar3 = *piVar3 + uVar5;
    return (p->iPage[(uint)lrn] << ((byte)p->nPageSize & 0x1f) | *p->pPages[p->iPage[(uint)lrn]]) -
           uVar5;
  }
  __assert_fail("nInts + 3 < (1 << p->nPageSize)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                ,0x133,"int Sat_MemAppend(Sat_Mem_t *, int *, int, int, int)");
}

Assistant:

static inline int Sat_MemAppend( Sat_Mem_t * p, int * pArray, int nSize, int lrn, int fPlus1 )
{
    clause * c;
    int * pPage = p->pPages[p->iPage[lrn]];
    int nInts = Sat_MemIntSize( nSize, lrn | fPlus1 );
    assert( nInts + 3 < (1 << p->nPageSize) );
    // need two extra at the begining of the page and one extra in the end
    if ( Sat_MemLimit(pPage) + nInts + 2 >= (1 << p->nPageSize) )
    { 
        p->iPage[lrn] += 2;
        if ( p->iPage[lrn] >= p->nPagesAlloc )
        {
            p->pPages = ABC_REALLOC( int *, p->pPages, p->nPagesAlloc * 2 );
            memset( p->pPages + p->nPagesAlloc, 0, sizeof(int *) * p->nPagesAlloc );
            p->nPagesAlloc *= 2;
        }
        if ( p->pPages[p->iPage[lrn]] == NULL )
            p->pPages[p->iPage[lrn]] = ABC_ALLOC( int, (int)(((word)1) << p->nPageSize) );
        pPage = p->pPages[p->iPage[lrn]];
        Sat_MemWriteLimit( pPage, 2 );
    }
    pPage[Sat_MemLimit(pPage)] = 0;
    c = (clause *)(pPage + Sat_MemLimit(pPage));
    c->size = nSize;
    c->lrn = lrn;
    if ( pArray )
        memcpy( c->lits, pArray, sizeof(int) * nSize );
    if ( lrn | fPlus1 )
        c->lits[c->size] = p->nEntries[lrn];
    p->nEntries[lrn]++;
    Sat_MemIncLimit( pPage, nInts );
    return Sat_MemHandCurrent(p, lrn) - nInts;
}